

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  EnumDescriptor *pEVar1;
  int *piVar2;
  Descriptor *pDVar3;
  EnumDescriptor **ppEVar4;
  iterator iVar5;
  int local_14;
  
  if (this->containing_type_ == (Descriptor *)0x0) {
    iVar5._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar5._M_current == piVar2) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar5,&local_14);
      pDVar3 = this->containing_type_;
      iVar5._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 5;
      iVar5._M_current = iVar5._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current;
      pDVar3 = (Descriptor *)0x0;
    }
    ppEVar4 = &this->file_->enum_types_;
    if (pDVar3 != (Descriptor *)0x0) {
      ppEVar4 = &pDVar3->enum_types_;
    }
    pEVar1 = *ppEVar4;
  }
  else {
    Descriptor::GetLocationPath(this->containing_type_,output);
    iVar5._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar5._M_current == piVar2) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar5,&local_14);
      iVar5._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 4;
      iVar5._M_current = iVar5._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current;
    }
    ppEVar4 = &this->file_->enum_types_;
    if (this->containing_type_ != (Descriptor *)0x0) {
      ppEVar4 = &this->containing_type_->enum_types_;
    }
    pEVar1 = *ppEVar4;
  }
  if (iVar5._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar5,&local_14);
  }
  else {
    *iVar5._M_current = (int)((ulong)((long)this - (long)pEVar1) >> 3) * -0x45d1745d;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}